

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

string * __thiscall
helics::prettyPrintString_abi_cxx11_
          (string *__return_storage_ptr__,helics *this,ActionMessage *command)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  char *__s;
  undefined1 *puVar4;
  double *pdVar5;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  basic_string_view<char,_std::char_traits<char>_> __x;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string local_98;
  string local_78;
  double local_58;
  double local_48;
  double dStack_40;
  undefined8 local_38;
  double local_28;
  
  this_00 = (string *)&local_98;
  __s = actionMessageType(cmd_ignore);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_78);
  __x._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
  __x._M_len = __return_storage_ptr__->_M_string_length;
  __y._M_str = "unknown";
  __y._M_len = 7;
  bVar2 = std::operator==(__x,__y);
  if (bVar2) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,' ');
    CLI::std::__cxx11::to_string(&local_78,*(int *)this);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_78);
  }
  else {
    iVar3 = *(int *)this;
    if (iVar3 - 0xcaU < 3) {
      return __return_storage_ptr__;
    }
    if (iVar3 == -0x10000028) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(__return_storage_ptr__,':');
      local_78._M_dataplus._M_p = *(pointer *)(this + 0x80);
      local_78._M_string_length = *(size_type *)(this + 0x90);
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_78);
      return __return_storage_ptr__;
    }
    if (iVar3 == 0x10000014) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(__return_storage_ptr__,':');
      pdVar1 = *(double **)(this + 0xa0);
      puVar4 = (undefined1 *)(pdVar1 + 8);
      iVar3 = (int)((ulong)(*(long *)(this + 0xa8) - (long)pdVar1) >> 5);
      if (iVar3 < 3) {
        puVar4 = emptyStr_abi_cxx11_;
      }
      pdVar5 = (double *)emptyStr_abi_cxx11_;
      if (0 < iVar3) {
        pdVar5 = pdVar1;
      }
      local_38 = *(undefined8 *)(this + 0x80);
      local_28 = (double)(*(long *)(this + 0x20) % 1000000000) * 1e-09 +
                 (double)(*(long *)(this + 0x20) / 1000000000);
      local_78._M_dataplus._M_p = *(pointer *)puVar4;
      local_78._M_string_length = *(size_type *)((long)puVar4 + 8);
      local_78.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(this + 8);
      local_58 = (double)CONCAT44(local_58._4_4_,*(undefined4 *)(this + 0xc));
      local_48 = *pdVar5;
      dStack_40 = pdVar5[1];
      args_03.field_1._0_4_ = *(undefined4 *)(this + 0xc);
      args_03.desc_ = (unsigned_long_long)&local_78;
      args_03.field_1._4_4_ = 0;
      fmt_03.size_ = 0xa4d11d;
      fmt_03.data_ = (char *)0x24;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_98,(v11 *)"From ({})({}:{}) To {} size {} at {}",fmt_03,args_03);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
      goto LAB_00279c6b;
    }
    if (iVar3 == -0x19) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(__return_storage_ptr__,':');
      local_78._M_dataplus._M_p = *(pointer *)(this + 0x80);
      local_78._M_string_length = *(size_type *)(this + 0x90);
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_78);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"--");
      if (((byte)this[0x1a] & 0x10) != 0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,"error");
        return __return_storage_ptr__;
      }
      CLI::std::__cxx11::to_string(&local_78,*(int *)(this + 0x10));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_78);
    }
    else {
      if (iVar3 == 0x23) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(__return_storage_ptr__,':');
        local_78.field_2._M_allocated_capacity =
             (size_type)
             ((double)(*(long *)(this + 0x20) % 1000000000) * 1e-09 +
             (double)(*(long *)(this + 0x20) / 1000000000));
        local_78._M_dataplus._M_p._0_4_ = *(undefined4 *)(this + 8);
        local_58 = (double)CONCAT44(local_58._4_4_,*(undefined4 *)(this + 0x10));
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)&local_78;
        fmt.size_ = 0x1a1;
        fmt.data_ = (char *)0x22;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_98,(v11 *)"From ({}) Granted Time({}) to ({})",fmt,args);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
        this_00 = (string *)&local_98;
        goto LAB_00279c6b;
      }
      if (iVar3 == 0x34) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(__return_storage_ptr__,':');
        local_58 = *(double *)(this + 0x80);
        local_48 = (double)(*(long *)(this + 0x20) % 1000000000) * 1e-09 +
                   (double)(*(long *)(this + 0x20) / 1000000000);
        local_78._M_dataplus._M_p._0_4_ = *(undefined4 *)(this + 8);
        local_78.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(this + 0x14);
        local_38 = CONCAT44(local_38._4_4_,*(undefined4 *)(this + 0x10));
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)&local_78;
        fmt_01.size_ = 0x1a411;
        fmt_01.data_ = (char *)0x28;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_98,(v11 *)"From ({}) handle({}) size {} at {} to {}",fmt_01,args_01);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
        this_00 = (string *)&local_98;
        goto LAB_00279c6b;
      }
      if (iVar3 == 500) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(__return_storage_ptr__,':');
        local_78.field_2._M_allocated_capacity =
             (size_type)
             ((double)(*(long *)(this + 0x20) % 1000000000) * 1e-09 +
             (double)(*(long *)(this + 0x20) / 1000000000));
        local_58 = (double)(*(long *)(this + 0x28) % 1000000000) * 1e-09 +
                   (double)(*(long *)(this + 0x28) / 1000000000);
        local_48 = (double)(*(long *)(this + 0x30) % 1000000000) * 1e-09 +
                   (double)(*(long *)(this + 0x30) / 1000000000);
        local_78._M_dataplus._M_p._0_4_ = *(undefined4 *)(this + 8);
        local_38 = CONCAT44(local_38._4_4_,*(undefined4 *)(this + 0x10));
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)&local_78;
        fmt_00.size_ = 0x1aaa1;
        fmt_00.data_ = (char *)0x22;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_98,(v11 *)"From ({}) Time({}, {}, {}) to ({})",fmt_00,args_00);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
        this_00 = (string *)&local_98;
        goto LAB_00279c6b;
      }
      if (iVar3 == -0x69) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(__return_storage_ptr__,':');
        local_78._M_dataplus._M_p = *(pointer *)(this + 0x80);
        local_78._M_string_length = *(size_type *)(this + 0x90);
        std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)__return_storage_ptr__,
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_78);
        return __return_storage_ptr__;
      }
      local_98._M_dataplus._M_p._0_4_ = *(undefined4 *)(this + 8);
      args_02.field_1.values_ = in_R9.values_;
      args_02.desc_ = (unsigned_long_long)&local_98;
      fmt_02.size_ = 1;
      fmt_02.data_ = (char *)0x8;
      ::fmt::v11::vformat_abi_cxx11_((string *)&local_78,(v11 *)":From {}",fmt_02,args_02);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_78);
    }
  }
  this_00 = &local_78;
LAB_00279c6b:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string prettyPrintString(const ActionMessage& command)
{
    std::string ret{actionMessageType(command.action())};
    if (std::string_view{ret} == std::string_view{unknownStr}) {
        ret.push_back(' ');
        ret.append(std::to_string(static_cast<int>(command.action())));
        return ret;
    }
    switch (command.action()) {
        case CMD_REG_FED:
            ret.push_back(':');
            ret.append(command.name());
            break;
        case CMD_FED_ACK:
            ret.push_back(':');
            ret.append(command.name());
            ret.append("--");
            if (checkActionFlag(command, error_flag)) {
                ret.append("error");
            } else {
                ret.append(std::to_string(command.dest_id.baseValue()));
            }
            break;
        case CMD_PUB:
            ret.push_back(':');
            ret.append(fmt::format("From ({}) handle({}) size {} at {} to {}",
                                   command.source_id.baseValue(),
                                   command.dest_handle.baseValue(),
                                   command.payload.size(),
                                   static_cast<double>(command.actionTime),
                                   command.dest_id.baseValue()));
            break;
        case CMD_REG_BROKER:
            ret.push_back(':');
            ret.append(command.name());
            break;
        case CMD_TIME_GRANT:
            ret.push_back(':');
            ret.append(fmt::format("From ({}) Granted Time({}) to ({})",
                                   command.source_id.baseValue(),
                                   static_cast<double>(command.actionTime),
                                   command.dest_id.baseValue()));
            break;
        case CMD_TIME_REQUEST:
            ret.push_back(':');
            ret.append(fmt::format("From ({}) Time({}, {}, {}) to ({})",
                                   command.source_id.baseValue(),
                                   static_cast<double>(command.actionTime),
                                   static_cast<double>(command.Te),
                                   static_cast<double>(command.Tdemin),
                                   command.dest_id.baseValue()));
            break;
        case CMD_FED_CONFIGURE_TIME:
        case CMD_FED_CONFIGURE_INT:
        case CMD_FED_CONFIGURE_FLAG:
            break;
        case CMD_SEND_MESSAGE:
            ret.push_back(':');
            ret.append(fmt::format("From ({})({}:{}) To {} size {} at {}",
                                   command.getString(origSourceStringLoc),
                                   command.source_id.baseValue(),
                                   command.source_handle.baseValue(),
                                   command.getString(targetStringLoc),
                                   command.payload.size(),
                                   static_cast<double>(command.actionTime)));
            break;
        default:
            ret.append(fmt::format(":From {}", command.source_id.baseValue()));
            break;
    }
    return ret;
}